

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

int Llb_ManFlowVerifyCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMinCut_local;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vMinCut), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vMinCut,local_2c);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Saig_ManRegNum(p);
    if (iVar1 <= local_2c) {
      return 1;
    }
    p_00 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_2c + iVar1);
    pAVar2 = Aig_ObjFanin0(pAVar2);
    iVar1 = Llb_ManFlowVerifyCut_rec(p,pAVar2);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Llb_ManFlowVerifyCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // mark the cut with the current traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // search from the latches for a path to the COs/CIs
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Llb_ManFlowVerifyCut_rec( p, Aig_ObjFanin0(pObj) ) )
            return 0;
    }
    return 1;
}